

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O2

void __thiscall
wasm::(anonymous_namespace)::GlobalRefining::run(wasm::Module*)::GetUpdater::GetUpdater(wasm::
(anonymous_namespace)::GlobalRefining&,wasm::Module__
          (GetUpdater *this,GlobalRefining *parent,Module *wasm)

{
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_Pass.runner = (PassRunner *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
                 super_Pass.name.field_2;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_Pass.name._M_string_length = 0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_Pass.name.field_2._M_local_buf[0] = '\0';
  *(bool *)((long)&(this->
                   super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>
                   ).super_Pass.passArg.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           + 0x20) = false;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
  super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.replacep = (Expression **)0x0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
  super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.usedFixed = 0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
  super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>)
           .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
           super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>)
           .super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
           super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task,_std::allocator<wasm::Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
  super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currFunction = (Function *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.
  super_Walker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>.currModule = (Module *)0x0;
  (this->super_WalkerPass<wasm::PostWalker<GetUpdater,_wasm::Visitor<GetUpdater,_void>_>_>).
  super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_011211b8;
  this->parent = parent;
  this->wasm = wasm;
  this->modified = false;
  return;
}

Assistant:

GetUpdater(GlobalRefining& parent, Module& wasm)
        : parent(parent), wasm(wasm) {}